

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridge.cpp
# Opt level: O3

POMCPPrior * __thiscall despot::Bridge::CreatePOMCPPrior(Bridge *this,string *name)

{
  int iVar1;
  POMCPPrior *this_00;
  ostream *poVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    this_00 = (POMCPPrior *)operator_new(0x78);
    despot::UniformPOMCPPrior::UniformPOMCPPrior((UniformPOMCPPrior *)this_00,(DSPOMDP *)this);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported POMCP prior: ");
        poVar2 = std::operator<<(poVar2,(string *)name);
        std::endl<char,std::char_traits<char>>(poVar2);
        exit(1);
      }
    }
    this_00 = (POMCPPrior *)operator_new(0x78);
    despot::POMCPPrior::POMCPPrior(this_00,(DSPOMDP *)this);
    *(undefined ***)this_00 = &PTR__POMCPPrior_0010aca0;
  }
  return this_00;
}

Assistant:

POMCPPrior* Bridge::CreatePOMCPPrior(string name) const {
	if (name == "UNIFORM") {
		return new UniformPOMCPPrior(this);
	} else if (name == "DEFAULT" || name == "HELP") {
		return new BridgePOMCPPrior(this);
	} else {
		cerr << "Unsupported POMCP prior: " << name << endl;
		exit(1);
		return NULL;
	}
}